

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O3

vector<Image,_std::allocator<Image>_> *
anon_unknown.dwarf_7b0b::LoadCgaSpritesheet
          (vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer pcVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  color_t *__cur;
  vector<Image,_std::allocator<Image>_> *extraout_RAX;
  vector<Image,_std::allocator<Image>_> *extraout_RAX_00;
  vector<Image,_std::allocator<Image>_> *pvVar6;
  long lVar7;
  ulong __n;
  pointer pIVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  allocator_type local_69 [9];
  vector<Image,_std::allocator<Image>_> *local_60;
  value_type local_50;
  
  uVar16 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_50.width_ = 0xf;
  local_50.height_ = 0xf;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x2a3);
  pcVar1 = local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
           super__Vector_impl_data._M_start + 0xe1;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcVar1;
  memset(local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x2a3);
  __n = uVar16 >> 8;
  local_60 = __return_storage_ptr__;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar1;
  std::vector<Image,_std::allocator<Image>_>::vector(__return_storage_ptr__,__n,&local_50,local_69);
  pvVar6 = extraout_RAX;
  if (local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    pvVar6 = extraout_RAX_00;
  }
  if (0xff < uVar16) {
    lVar11 = 4;
    lVar7 = 0;
    do {
      pIVar8 = (local_60->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar7;
      lVar9 = 1;
      iVar10 = 0;
      lVar12 = lVar11;
      do {
        lVar13 = 3;
        lVar14 = (long)iVar10;
        lVar15 = lVar12;
        while( true ) {
          bVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar15];
          lVar5 = (ulong)(bVar2 >> 6) * 3;
          lVar4 = (pIVar8->width_ * lVar14 + lVar13) * 3;
          lVar3 = *(long *)&(pIVar8->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                            _M_impl.super__Vector_impl_data;
          *(undefined1 *)(lVar3 + -7 + lVar4) = (anonymous_namespace)::cga_palette[lVar5 + 2];
          *(undefined2 *)(lVar3 + -9 + lVar4) =
               *(undefined2 *)((anonymous_namespace)::cga_palette + lVar5);
          lVar5 = (ulong)(bVar2 >> 4 & 3) * 3;
          lVar4 = (pIVar8->width_ * lVar14 + lVar13) * 3;
          lVar3 = *(long *)&(pIVar8->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                            _M_impl.super__Vector_impl_data;
          *(undefined1 *)(lVar3 + -4 + lVar4) = (anonymous_namespace)::cga_palette[lVar5 + 2];
          *(undefined2 *)(lVar3 + -6 + lVar4) =
               *(undefined2 *)((anonymous_namespace)::cga_palette + lVar5);
          lVar5 = (ulong)(bVar2 >> 2 & 3) * 3;
          lVar4 = (pIVar8->width_ * lVar14 + lVar13) * 3;
          lVar3 = *(long *)&(pIVar8->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                            _M_impl.super__Vector_impl_data;
          *(undefined2 *)(lVar3 + -3 + lVar4) =
               *(undefined2 *)((anonymous_namespace)::cga_palette + lVar5);
          pvVar6 = (vector<Image,_std::allocator<Image>_> *)
                   (ulong)(byte)(anonymous_namespace)::cga_palette[lVar5 + 2];
          *(undefined1 *)(lVar3 + -1 + lVar4) = (anonymous_namespace)::cga_palette[lVar5 + 2];
          if (lVar13 == 0xf) break;
          lVar5 = (ulong)(bVar2 & 3) * 3;
          lVar3 = *(long *)&(pIVar8->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                            _M_impl.super__Vector_impl_data;
          lVar4 = (pIVar8->width_ * lVar14 + lVar13) * 3;
          *(undefined1 *)(lVar3 + 2 + lVar4) = (anonymous_namespace)::cga_palette[lVar5 + 2];
          *(undefined2 *)(lVar3 + lVar4) =
               *(undefined2 *)((anonymous_namespace)::cga_palette + lVar5);
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 4;
        }
        lVar9 = lVar9 + 1;
        lVar12 = lVar12 + 4;
        iVar10 = iVar10 + 1;
      } while (lVar9 != 0x10);
      lVar7 = lVar7 + 1;
      lVar11 = lVar11 + 0x100;
    } while (lVar7 != __n + (__n == 0));
  }
  return pvVar6;
}

Assistant:

std::vector<Image> LoadCgaSpritesheet(std::vector<uint8_t> const& data) {
  auto const num_images = data.size() / kImageAlignmentInBytes;
  std::vector<Image> images(num_images, Image(kImageWidth, kImageHeight));

  for (auto image_index = 0; image_index < num_images; ++image_index) {
    auto& image = images[image_index];
    auto const image_offset = image_index * kImageAlignmentInBytes;

    // Ignore first full row (contains garbage)
    for (auto y = 1; y < kCellHeight; ++y) {
      for (auto x = 0; x < kCgaBytesPerRow; ++x) {
        auto const byte_offset = image_offset + (y * kCgaBytesPerRow) + x;
        auto const b = data[byte_offset];

        // (y - 1) to compensate for ignoring the first row
        image.Set(x * kCgaPixelsPerByte, y - 1, cga_palette[HalfNibble(b, 3)]);
        image.Set(x * kCgaPixelsPerByte + 1, y - 1,
                  cga_palette[HalfNibble(b, 2)]);
        image.Set(x * kCgaPixelsPerByte + 2, y - 1,
                  cga_palette[HalfNibble(b, 1)]);

        // Last byte of row only contains 3 pixels (because final image
        // is 15 wide, not 16 wide)
        if (x != kCgaBytesPerRow - 1) {
          image.Set(x * kCgaPixelsPerByte + 3, y - 1,
                    cga_palette[HalfNibble(b, 0)]);
        }
      }
    }
  }

  return images;
}